

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,SizedPtr mem,ThreadSafeArena *parent)

{
  ArenaBlock *this_00;
  __pointer_type pcVar1;
  bool bVar2;
  SerialArena *size;
  char *pcVar3;
  string *min_bytes;
  string *extraout_RAX;
  ArenaBlock *this_01;
  char *pcVar4;
  ThreadSafeArena *pTVar5;
  SerialArena *this_02;
  undefined8 unaff_R12;
  SizedPtr SVar6;
  SerialArena *pSStack_70;
  LogMessageFatal aLStack_68 [16];
  ThreadSafeArena *pTStack_58;
  undefined8 uStack_50;
  SerialArena *pSStack_48;
  SerialArena *pSStack_40;
  
  pTVar5 = (ThreadSafeArena *)mem.n;
  size = (SerialArena *)mem.p;
  if (size < (SerialArena *)0x88) {
    pSStack_40 = (SerialArena *)0x1c3708;
    min_bytes = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                          (0x88,(ulong)size,
                           "kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize <= mem.n");
  }
  else {
    min_bytes = (string *)0x0;
  }
  if (min_bytes == (string *)0x0) {
    unaff_R12 = 0;
    pSStack_40 = (SerialArena *)0x1c366c;
    ArenaBlock::ArenaBlock((ArenaBlock *)this,(ArenaBlock *)0x0,(size_t)size);
    pSStack_40 = (SerialArena *)0x1c3679;
    size = (SerialArena *)ArenaBlock::Pointer((ArenaBlock *)this,0x10);
    pSStack_40 = (SerialArena *)0x1c3689;
    pcVar3 = ArenaBlock::Pointer((ArenaBlock *)this,0x88);
    (size->ptr_)._M_b._M_p = pcVar3;
    pSStack_40 = (SerialArena *)0x1c369c;
    pcVar3 = ArenaBlock::Pointer((ArenaBlock *)this,(ulong)this->limit_ & 0xfffffffffffffff8);
    size->limit_ = pcVar3;
    pSStack_40 = (SerialArena *)0x1c36ad;
    pcVar3 = ArenaBlock::Pointer((ArenaBlock *)this,0x88);
    size->prefetch_ptr_ = pcVar3;
    (size->cleanup_list_).head_ = (Chunk *)0x0;
    (size->cleanup_list_).next_ = (CleanupNode *)0x0;
    (size->cleanup_list_).limit_ = (CleanupNode *)0x0;
    (size->cleanup_list_).prefetch_ptr_ = (char *)0x0;
    (size->string_block_)._M_b._M_p = (__pointer_type)0x0;
    (size->string_block_unused_).super___atomic_base<unsigned_long>._M_i = 0;
    (size->head_)._M_b._M_p = (__pointer_type)this;
    (size->space_used_).super___atomic_base<unsigned_long>._M_i = 0;
    pcVar3 = this->limit_;
    (size->space_allocated_).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict3)pcVar3;
    size->parent_ = pTVar5;
    size->cached_block_length_ = '\0';
    size->cached_blocks_ = (CachedBlock **)0x0;
    if (pcVar3 != (char *)0x0) {
      return size;
    }
    pSStack_40 = (SerialArena *)0x1c3717;
    New((SerialArena *)&stack0xffffffffffffffd0);
    min_bytes = extraout_RAX;
  }
  this_02 = (SerialArena *)&stack0xffffffffffffffd0;
  pSStack_40 = (SerialArena *)AllocateAlignedFallback;
  New();
  this_00 = (this_02->head_)._M_b._M_p;
  pTStack_58 = pTVar5;
  uStack_50 = unaff_R12;
  pSStack_48 = this;
  pSStack_40 = size;
  if (this_00->size != 0) {
    pcVar1 = (this_02->ptr_)._M_b._M_p;
    pcVar3 = ArenaBlock::Pointer(this_00,0x10);
    (this_02->space_used_).super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict3)
         (pcVar1 + ((this_02->space_used_).super___atomic_base<unsigned_long>._M_i - (long)pcVar3));
  }
  SVar6 = anon_unknown_12::AllocateBlock
                    ((AllocationPolicy *)
                     ((this_02->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8),this_00->size,
                     (size_t)min_bytes);
  this_01 = (ArenaBlock *)SVar6.p;
  (this_02->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this_02->space_allocated_).super___atomic_base<unsigned_long>._M_i + SVar6.n;
  ArenaBlock::ArenaBlock(this_01,this_00,SVar6.n);
  pcVar3 = ArenaBlock::Pointer(this_01,0x10);
  pcVar4 = ArenaBlock::Pointer(this_01,this_01->size & 0xfffffffffffffff8);
  (this_02->ptr_)._M_b._M_p = pcVar3;
  this_02->prefetch_ptr_ = pcVar3;
  this_02->limit_ = pcVar4;
  (this_02->head_)._M_b._M_p = this_01;
  pSStack_70 = (SerialArena *)0x0;
  bVar2 = MaybeAllocateAligned(this_02,(size_t)min_bytes,&pSStack_70);
  if (bVar2) {
    return pSStack_70;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_68,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x114,3,"res");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_68);
}

Assistant:

SerialArena* SerialArena::New(SizedPtr mem, ThreadSafeArena& parent) {
  ABSL_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent.arena_stats_.MutableStats(),
                                            /*used=*/0, /*allocated=*/mem.n,
                                            /*wasted=*/0);
  auto b = new (mem.p) ArenaBlock{nullptr, mem.n};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, parent);
}